

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O0

void __thiscall
Clasp::SingleOwnerPtr<Clasp::ProgramBuilder,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Clasp::ProgramBuilder,_Clasp::DeleteObject> *this,ProgramBuilder *x)

{
  bool bVar1;
  ProgramBuilder *pPVar2;
  _func_int **pp_Var3;
  ProgramBuilder *in_RSI;
  ProgramBuilder *in_RDI;
  DeleteObject deleter;
  
  pPVar2 = get((SingleOwnerPtr<Clasp::ProgramBuilder,_Clasp::DeleteObject> *)0x130d36);
  if ((in_RSI != pPVar2) &&
     (bVar1 = is_owner((SingleOwnerPtr<Clasp::ProgramBuilder,_Clasp::DeleteObject> *)0x130d4c),
     bVar1)) {
    release((SingleOwnerPtr<Clasp::ProgramBuilder,_Clasp::DeleteObject> *)in_RSI);
    DeleteObject::operator()((DeleteObject *)in_RSI,in_RDI);
  }
  pp_Var3 = (_func_int **)
            set_bit<unsigned_long>((unsigned_long)in_RSI,(uint)((ulong)in_RDI >> 0x20));
  in_RDI->_vptr_ProgramBuilder = pp_Var3;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}